

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  _Base_ptr *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType TVar3;
  long *plVar4;
  size_type *psVar5;
  string pdbSupportVar;
  string language;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_50,(GeneratorExpressionContent *)context);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"TARGET_PDB_FILE not allowed for IMPORTED targets.","");
    reportError((cmGeneratorExpressionContext *)target,&local_50,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  config = &(target->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cmGeneratorTarget::GetLinkerLanguage(&local_50,(cmGeneratorTarget *)this,(string *)config);
  std::operator+(&local_b0,"CMAKE_",&local_50);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_90.field_2._M_allocated_capacity = *psVar5;
    local_90.field_2._8_8_ = plVar4[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar5;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmMakefile::IsOn(*(cmMakefile **)
                            (*(long *)&(target->ExplicitObjectName)._M_t._M_impl.
                                       super__Rb_tree_header._M_header + 0x28),&local_90);
  if (bVar2) {
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if ((TVar3 < OBJECT_LIBRARY) && (TVar3 != STATIC_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (__return_storage_ptr__,(cmGeneratorTarget *)this,(string *)config);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmGeneratorTarget::GetPDBName(&local_b0,(cmGeneratorTarget *)this,(string *)config);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003bc201;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "TARGET_PDB_FILE is allowed only for targets with linker created artifacts.","");
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_70);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"TARGET_PDB_FILE is not supported by the target linker.","");
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003bc201:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE not allowed for IMPORTED targets.");
      return std::string();
    }

    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if (!context->LG->GetMakefile()->IsOn(pdbSupportVar)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is not supported by the target linker.");
      return std::string();
    }

    cmStateEnums::TargetType targetType = target->GetType();

    if (targetType != cmStateEnums::SHARED_LIBRARY &&
        targetType != cmStateEnums::MODULE_LIBRARY &&
        targetType != cmStateEnums::EXECUTABLE) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
    }

    std::string result = target->GetPDBDirectory(context->Config);
    result += "/";
    result += target->GetPDBName(context->Config);
    return result;
  }